

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chess.cpp
# Opt level: O3

void __thiscall Interface::SetOption(Interface *this,string *sParams)

{
  ostream *poVar1;
  int iVar2;
  istream *piVar3;
  size_t nValue;
  string sName;
  string sParam;
  stringstream sfail;
  stringstream ss;
  undefined1 *local_3a0;
  long local_398;
  undefined1 local_390 [16];
  char *local_380;
  long local_378;
  char local_370 [16];
  string local_360;
  undefined1 local_340 [128];
  ios_base local_2c0 [264];
  stringstream local_1b8 [128];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8,(string *)sParams,_S_out|_S_in);
  local_380 = local_370;
  local_378 = 0;
  local_370[0] = '\0';
  local_3a0 = local_390;
  local_398 = 0;
  local_390[0] = 0;
  poVar1 = (ostream *)(local_340 + 0x10);
  while( true ) {
    piVar3 = std::operator>>((istream *)local_1b8,(string *)&local_380);
    if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) break;
    iVar2 = std::__cxx11::string::compare((char *)&local_380);
    if (iVar2 == 0) {
      std::operator>>((istream *)local_1b8,(string *)&local_3a0);
    }
    else {
      iVar2 = std::__cxx11::string::compare((char *)&local_380);
      if (iVar2 == 0) {
        std::istream::_M_extract<unsigned_long>((ulong *)local_1b8);
      }
      else {
        std::__cxx11::stringstream::stringstream((stringstream *)local_340);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar1,"Unrecognized SetOption parameter: ",0x22);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_380,local_378);
        std::__cxx11::stringbuf::str();
        Notify(this,&local_360);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_360._M_dataplus._M_p != &local_360.field_2) {
          operator_delete(local_360._M_dataplus._M_p);
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)local_340);
        std::ios_base::~ios_base(local_2c0);
      }
    }
  }
  if (local_398 == 0) {
    local_340._0_8_ = poVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_340,"SetOption: Could not find name of the option to set","");
    Notify(this,(string *)local_340);
    if ((ostream *)local_340._0_8_ != poVar1) {
      operator_delete((void *)local_340._0_8_);
    }
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)&local_3a0);
    if (iVar2 == 0) {
      (*s_pPositionHashTable->_vptr_PositionHashTable[6])(s_pPositionHashTable,0x100000);
    }
  }
  if (local_3a0 != local_390) {
    operator_delete(local_3a0);
  }
  if (local_380 != local_370) {
    operator_delete(local_380);
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

INTERFACE_PROTOTYPE( SetOption )
    {
        stringstream ss( sParams );
        string sParam, sName;
        size_t nValue = 1;

        while ( ss >> sParam )
        {
            if ( sParam == "name" )
                ss >> sName;
            else if ( sParam == "value" )
                ss >> nValue;
            else
            {
                stringstream sfail;
                sfail << "Unrecognized SetOption parameter: " << sParam;
                Notify( sfail.str() );
            }
        }

        if ( !sName.empty() )
        {
            if ( sName == "Hash" )
                s_pPositionHashTable->SetSize( nValue * 1024 * 1024 );
        }
        else
            Notify( "SetOption: Could not find name of the option to set" );
    }